

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O1

CommandOptions * write_timed_text_file(CommandOptions *Options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  AESEncContext *pAVar13;
  HMACContext *this;
  long lVar14;
  long in_RSI;
  MyInfo *pMVar15;
  undefined8 *puVar16;
  _Self __tmp;
  _List_node_base *p_Var17;
  byte bVar18;
  FortunaRNG RNG;
  MXFWriter Writer;
  DCSubtitleParser Parser;
  WriterInfo Info;
  string XMLDoc;
  TimedTextDescriptor TDesc;
  FrameBuffer FrameBuffer;
  byte_t IV_buf [16];
  FortunaRNG local_351;
  AESEncContext *local_350;
  undefined1 local_348 [32];
  undefined1 local_328 [64];
  bool local_2e8;
  bool bStack_2e7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  long *local_2a0 [2];
  long local_290 [2];
  LabelSet_t local_280;
  UUID local_278 [3];
  HMACContext *local_210;
  TimedTextDescriptor local_208;
  undefined1 local_170 [88];
  undefined1 local_118 [24];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  bVar18 = 0;
  ASDCP::TimedText::DCSubtitleParser::DCSubtitleParser((DCSubtitleParser *)(local_348 + 0x10));
  ASDCP::TimedText::MXFWriter::MXFWriter((MXFWriter *)local_348);
  ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)local_170);
  local_170._56_8_ = local_170 + 0x48;
  local_170._0_8_ = &PTR__FrameBuffer_00115d10;
  local_170._64_8_ = (char *)0x0;
  local_170[0x48] = '\0';
  local_170._40_8_ = (char *)0x0;
  local_170._48_8_ = (char *)0x0;
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor(&local_208);
  ASDCP::TimedText::DCSubtitleParser::OpenRead((string *)Options);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->asset_id_flag;
  iVar1._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar1) {
    ASDCP::TimedText::DCSubtitleParser::FillTimedTextDescriptor((TimedTextDescriptor *)local_98);
    Kumu::Result_t::~Result_t(local_98);
    ASDCP::FrameBuffer::Capacity((uint)local_100);
    Kumu::Result_t::~Result_t(local_100);
    if (*(char *)(in_RSI + 5) == '\x01') {
      fputs("D-Cinema Timed-Text Descriptor:\n",_stderr);
      ASDCP::TimedText::DescriptorDump(&local_208,(_IO_FILE *)0x0);
    }
  }
  iVar2._0_1_ = Options->error_flag;
  iVar2._1_1_ = Options->key_flag;
  iVar2._2_1_ = Options->asset_id_flag;
  iVar2._3_1_ = Options->encrypt_header_flag;
  if ((iVar2 < 0) || (*(char *)(in_RSI + 0xc) != '\0')) {
    this = (HMACContext *)0x0;
    pAVar13 = (AESEncContext *)0x0;
  }
  else {
    pMVar15 = &s_MyInfo;
    puVar16 = (undefined8 *)local_328;
    for (lVar14 = 8; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar16 = *(undefined8 *)(pMVar15->super_WriterInfo).ProductUUID;
      pMVar15 = (MyInfo *)((long)pMVar15 + ((ulong)bVar18 * -2 + 1) * 8);
      puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    }
    local_2e8 = s_MyInfo.super_WriterInfo.EncryptedEssence;
    bStack_2e7 = s_MyInfo.super_WriterInfo.UsesHMAC;
    local_2e0._M_allocated_capacity = (size_type)&local_2d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
    local_2c0._M_p = (pointer)&local_2b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c0,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a0,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductName._M_string_length);
    local_280 = s_MyInfo.super_WriterInfo.LabelSetType;
    if (*(char *)(in_RSI + 2) == '\x01') {
      local_328._16_8_ = *(undefined8 *)(in_RSI + 0x49);
      local_328._24_8_ = *(undefined8 *)(in_RSI + 0x51);
    }
    else {
      Kumu::GenRandomUUID(local_328 + 0x10);
    }
    local_280 = 2;
    fwrite("ATTENTION! Writing SMPTE Universal Labels\n",0x2a,1,_stderr);
    if (*(char *)(in_RSI + 1) == '\x01') {
      Kumu::FortunaRNG::FortunaRNG(&local_351);
      Kumu::GenRandomUUID(local_328 + 0x20);
      local_2e8 = true;
      if (*(char *)(in_RSI + 0x38) == '\x01') {
        local_328._48_4_ = *(undefined4 *)(in_RSI + 0x39);
        local_328._52_4_ = *(undefined4 *)(in_RSI + 0x3d);
        local_328._56_4_ = *(undefined4 *)(in_RSI + 0x41);
        local_328._60_4_ = *(undefined4 *)(in_RSI + 0x45);
      }
      else {
        local_278[0].super_Identifier<16U>.m_HasValue = false;
        local_278[0].super_Identifier<16U>.m_Value[0] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[1] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[2] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[3] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[4] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[5] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[6] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[7] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[8] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[9] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[10] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[0xb] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[0xc] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[0xd] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[0xe] = '\0';
        local_278[0].super_Identifier<16U>.m_Value[0xf] = '\0';
        local_278[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
             (_func_int **)&PTR__IArchive_00115b98;
        Kumu::GenRandomValue(local_278);
        local_328._48_4_ = local_278[0].super_Identifier<16U>.m_Value._0_4_;
        local_328._52_4_ = local_278[0].super_Identifier<16U>.m_Value._4_4_;
        local_328._56_4_ = local_278[0].super_Identifier<16U>.m_Value._8_4_;
        local_328._60_4_ = local_278[0].super_Identifier<16U>.m_Value._12_4_;
      }
      pAVar13 = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(pAVar13);
      local_350 = pAVar13;
      ASDCP::AESEncContext::InitKey((uchar *)local_278);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_278);
      Kumu::Result_t::~Result_t((Result_t *)local_278);
      iVar10._0_1_ = Options->error_flag;
      iVar10._1_1_ = Options->key_flag;
      iVar10._2_1_ = Options->asset_id_flag;
      iVar10._3_1_ = Options->encrypt_header_flag;
      if (-1 < iVar10) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_351,(uint)local_118);
        ASDCP::AESEncContext::SetIVec((uchar *)local_278);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_278);
        Kumu::Result_t::~Result_t((Result_t *)local_278);
      }
      iVar11._0_1_ = Options->error_flag;
      iVar11._1_1_ = Options->key_flag;
      iVar11._2_1_ = Options->asset_id_flag;
      iVar11._3_1_ = Options->encrypt_header_flag;
      if ((iVar11 < 0) || (*(char *)(in_RSI + 4) != '\x01')) {
        this = (HMACContext *)0x0;
      }
      else {
        bStack_2e7 = true;
        this = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this);
        ASDCP::HMACContext::InitKey((uchar *)local_278,(LabelSet_t)this);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_278);
        Kumu::Result_t::~Result_t((Result_t *)local_278);
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_351);
    }
    else {
      this = (HMACContext *)0x0;
      local_350 = (AESEncContext *)0x0;
    }
    iVar12._0_1_ = Options->error_flag;
    iVar12._1_1_ = Options->key_flag;
    iVar12._2_1_ = Options->asset_id_flag;
    iVar12._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar12) {
      ASDCP::TimedText::MXFWriter::OpenWrite
                ((string *)local_278,(WriterInfo *)local_348,(TimedTextDescriptor *)(in_RSI + 0x60),
                 (uint)local_328);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_278);
      Kumu::Result_t::~Result_t((Result_t *)local_278);
    }
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0],local_290[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_p != &local_2b0) {
      operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
    }
    pAVar13 = local_350;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_allocated_capacity != &local_2d0) {
      operator_delete((void *)local_2e0._M_allocated_capacity,local_2d0._M_allocated_capacity + 1);
      pAVar13 = local_350;
    }
  }
  iVar3._0_1_ = Options->error_flag;
  iVar3._1_1_ = Options->key_flag;
  iVar3._2_1_ = Options->asset_id_flag;
  iVar3._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar3) {
    local_278[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)(local_278[0].super_Identifier<16U>.m_Value + 7);
    local_278[0].super_Identifier<16U>.m_HasValue = false;
    local_278[0].super_Identifier<16U>.m_Value[0] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[1] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[2] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[3] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[4] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[5] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[6] = '\0';
    local_278[0].super_Identifier<16U>.m_Value[7] = '\0';
    ASDCP::TimedText::DCSubtitleParser::ReadTimedTextResource((string *)local_328);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
    Kumu::Result_t::~Result_t((Result_t *)local_328);
    iVar4._0_1_ = Options->error_flag;
    iVar4._1_1_ = Options->key_flag;
    iVar4._2_1_ = Options->asset_id_flag;
    iVar4._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar4) {
      ASDCP::TimedText::MXFWriter::WriteTimedTextResource
                ((string *)local_328,(AESEncContext *)local_348,(HMACContext *)local_278);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
      Kumu::Result_t::~Result_t((Result_t *)local_328);
    }
    local_350 = pAVar13;
    local_210 = this;
    if ((local_208.ResourceList.
         super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&local_208.ResourceList) &&
       (iVar5._0_1_ = Options->error_flag, iVar5._1_1_ = Options->key_flag,
       iVar5._2_1_ = Options->asset_id_flag, iVar5._3_1_ = Options->encrypt_header_flag, -1 < iVar5)
       ) {
      p_Var17 = local_208.ResourceList.
                super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      do {
        ASDCP::TimedText::DCSubtitleParser::ReadAncillaryResource
                  ((uchar *)local_328,(FrameBuffer *)(local_348 + 0x10),
                   (IResourceResolver *)(p_Var17 + 1));
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
        Kumu::Result_t::~Result_t((Result_t *)local_328);
        iVar6._0_1_ = Options->error_flag;
        iVar6._1_1_ = Options->key_flag;
        iVar6._2_1_ = Options->asset_id_flag;
        iVar6._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar6) {
          if (*(char *)(in_RSI + 5) == '\x01') {
            ASDCP::TimedText::FrameBuffer::Dump((_IO_FILE *)local_170,(uint)_stderr);
          }
          if (*(char *)(in_RSI + 0xc) == '\0') {
            ASDCP::TimedText::MXFWriter::WriteAncillaryResource
                      ((FrameBuffer *)local_328,(AESEncContext *)local_348,(HMACContext *)local_170)
            ;
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
            Kumu::Result_t::~Result_t((Result_t *)local_328);
          }
        }
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->asset_id_flag;
        iVar7._3_1_ = Options->encrypt_header_flag;
        if (iVar7 == Kumu::RESULT_ENDOFFILE) {
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
        }
        p_Var17 = p_Var17->_M_next;
      } while ((p_Var17 != (_List_node_base *)&local_208.ResourceList) &&
              (iVar8._0_1_ = Options->error_flag, iVar8._1_1_ = Options->key_flag,
              iVar8._2_1_ = Options->asset_id_flag, iVar8._3_1_ = Options->encrypt_header_flag,
              -1 < iVar8));
    }
    iVar9._0_1_ = Options->error_flag;
    iVar9._1_1_ = Options->key_flag;
    iVar9._2_1_ = Options->asset_id_flag;
    iVar9._3_1_ = Options->encrypt_header_flag;
    if ((-1 < iVar9) && (*(char *)(in_RSI + 0xc) == '\0')) {
      ASDCP::TimedText::MXFWriter::Finalize();
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
      Kumu::Result_t::~Result_t((Result_t *)local_328);
    }
    if (local_278[0].super_Identifier<16U>.super_IArchive._vptr_IArchive !=
        (_func_int **)(local_278[0].super_Identifier<16U>.m_Value + 7)) {
      operator_delete(local_278[0].super_Identifier<16U>.super_IArchive._vptr_IArchive,
                      CONCAT35(local_278[0].super_Identifier<16U>.m_Value._12_3_,
                               CONCAT41(local_278[0].super_Identifier<16U>.m_Value._8_4_,
                                        local_278[0].super_Identifier<16U>.m_Value[7])) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.RFC5646LanguageTagList._M_dataplus._M_p !=
      &local_208.RFC5646LanguageTagList.field_2) {
    operator_delete(local_208.RFC5646LanguageTagList._M_dataplus._M_p,
                    local_208.RFC5646LanguageTagList.field_2._M_allocated_capacity + 1);
  }
  while (local_208.ResourceList.
         super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&local_208.ResourceList) {
    p_Var17 = (local_208.ResourceList.
               super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
               ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_208.ResourceList.
                    super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0x28);
    local_208.ResourceList.
    super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var17;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.EncodingName._M_dataplus._M_p != &local_208.EncodingName.field_2) {
    operator_delete(local_208.EncodingName._M_dataplus._M_p,
                    local_208.EncodingName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.NamespaceName._M_dataplus._M_p != &local_208.NamespaceName.field_2) {
    operator_delete(local_208.NamespaceName._M_dataplus._M_p,
                    local_208.NamespaceName.field_2._M_allocated_capacity + 1);
  }
  ASDCP::TimedText::FrameBuffer::~FrameBuffer((FrameBuffer *)local_170);
  ASDCP::TimedText::MXFWriter::~MXFWriter((MXFWriter *)local_348);
  ASDCP::TimedText::DCSubtitleParser::~DCSubtitleParser((DCSubtitleParser *)(local_348 + 0x10));
  return Options;
}

Assistant:

Result_t
write_timed_text_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  TimedText::DCSubtitleParser  Parser;
  TimedText::MXFWriter    Writer;
  TimedText::FrameBuffer  FrameBuffer;
  TimedText::TimedTextDescriptor TDesc;
  byte_t            IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      Parser.FillTimedTextDescriptor(TDesc);
      FrameBuffer.Capacity(Options.fb_size);

      if ( Options.verbose_flag )
	{
	  fputs("D-Cinema Timed-Text Descriptor:\n", stderr);
	  TimedText::DescriptorDump(TDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

      // 428-7 IN 429-5 always uses SMPTE labels
      Info.LabelSetType = LS_MXF_SMPTE;
      fprintf(stderr, "ATTENTION! Writing SMPTE Universal Labels\n");

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file, Info, TDesc);
    }

  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  TimedText::ResourceList_t::const_iterator ri;

  result = Parser.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    result = Writer.WriteTimedTextResource(XMLDoc, Context, HMAC);

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Parser.ReadAncillaryResource((*ri).ResourceID, FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);

	  if ( ! Options.no_write_flag )
	    {
	      result = Writer.WriteAncillaryResource(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}